

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O1

void post(uv__queue *q,uv__work_kind kind)

{
  int iVar1;
  uv__queue *puStack_10;
  uv__work_kind kind_local;
  uv__queue *q_local;
  
  uv_mutex_lock(&mutex);
  puStack_10 = q;
  if (kind == UV__WORK_SLOW_IO) {
    uv__queue_insert_tail(&slow_io_pending_wq,q);
    iVar1 = uv__queue_empty(&run_slow_work_message);
    if (iVar1 == 0) {
      uv_mutex_unlock(&mutex);
      return;
    }
    puStack_10 = &run_slow_work_message;
  }
  uv__queue_insert_tail(&wq,puStack_10);
  if (idle_threads != 0) {
    uv_cond_signal(&cond);
  }
  uv_mutex_unlock(&mutex);
  return;
}

Assistant:

static void post(struct uv__queue* q, enum uv__work_kind kind) {
  uv_mutex_lock(&mutex);
  if (kind == UV__WORK_SLOW_IO) {
    /* Insert into a separate queue. */
    uv__queue_insert_tail(&slow_io_pending_wq, q);
    if (!uv__queue_empty(&run_slow_work_message)) {
      /* Running slow I/O tasks is already scheduled => Nothing to do here.
         The worker that runs said other task will schedule this one as well. */
      uv_mutex_unlock(&mutex);
      return;
    }
    q = &run_slow_work_message;
  }

  uv__queue_insert_tail(&wq, q);
  if (idle_threads > 0)
    uv_cond_signal(&cond);
  uv_mutex_unlock(&mutex);
}